

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall
RTree::range_search(RTree *this,Polygon *query,vector<Polygon_*,_std::allocator<Polygon_*>_> *ans)

{
  int iVar1;
  Point local_d8;
  Point local_d0;
  undefined1 local_c8 [8];
  Polygon q;
  Point local_88;
  Point local_80;
  Point local_78;
  Point local_70;
  int local_68;
  Point PStack_64;
  int y_max;
  int local_5c;
  Point PStack_58;
  int x_max;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  int local_30;
  Point PStack_2c;
  int y_min;
  int local_24;
  vector<Polygon_*,_std::allocator<Polygon_*>_> *pvStack_20;
  int x_min;
  vector<Polygon_*,_std::allocator<Polygon_*>_> *ans_local;
  Polygon *query_local;
  RTree *this_local;
  
  pvStack_20 = ans;
  ans_local = (vector<Polygon_*,_std::allocator<Polygon_*>_> *)query;
  query_local = (Polygon *)this;
  PStack_2c = Polygon::get_Pmin(query);
  local_24 = Point::get_X(&stack0xffffffffffffffd4);
  local_38 = Polygon::get_Pmin(query);
  local_30 = Point::get_Y(&local_38);
  local_40 = Polygon::get_Pmax(query);
  iVar1 = Point::get_X(&local_40);
  if (iVar1 < local_24) {
    local_48 = Polygon::get_Pmax(query);
    local_24 = Point::get_X(&local_48);
  }
  local_50 = Polygon::get_Pmax(query);
  iVar1 = Point::get_Y(&local_50);
  if (iVar1 < local_30) {
    PStack_58 = Polygon::get_Pmax(query);
    local_30 = Point::get_Y(&stack0xffffffffffffffa8);
  }
  PStack_64 = Polygon::get_Pmin(query);
  local_5c = Point::get_X(&stack0xffffffffffffff9c);
  local_70 = Polygon::get_Pmin(query);
  local_68 = Point::get_Y(&local_70);
  local_78 = Polygon::get_Pmax(query);
  iVar1 = Point::get_X(&local_78);
  if (local_5c < iVar1) {
    local_80 = Polygon::get_Pmax(query);
    local_5c = Point::get_X(&local_80);
  }
  local_88 = Polygon::get_Pmax(query);
  iVar1 = Point::get_Y(&local_88);
  if (local_68 < iVar1) {
    q._48_8_ = Polygon::get_Pmax(query);
    local_68 = Point::get_Y((Point *)&q.corners);
  }
  Point::Point(&local_d0,local_24,local_30);
  Point::Point(&local_d8,local_5c,local_68);
  Polygon::Polygon((Polygon *)local_c8,local_d0,local_d8);
  range_search_recursive(this,this->root,(Polygon *)local_c8,pvStack_20);
  Polygon::~Polygon((Polygon *)local_c8);
  return;
}

Assistant:

void RTree::range_search(Polygon query, std::vector<Polygon *> & ans){
    int x_min = query.get_Pmin().get_X();
    int y_min = query.get_Pmin().get_Y();
    if(query.get_Pmax().get_X() < x_min)
        x_min = query.get_Pmax().get_X();
    if(query.get_Pmax().get_Y() < y_min)
        y_min = query.get_Pmax().get_Y();
    int x_max = query.get_Pmin().get_X();
    int y_max = query.get_Pmin().get_Y();
    if(query.get_Pmax().get_X() > x_max)
        x_max = query.get_Pmax().get_X();
    if(query.get_Pmax().get_Y() > y_max)
        y_max = query.get_Pmax().get_Y();
    Polygon q(Point(x_min,y_min),Point(x_max,y_max));
    range_search_recursive(this->root, q, ans);
}